

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathExtras.h
# Opt level: O0

size_t llvm::detail::TrailingZerosCounter<unsigned_long,_8UL>::count
                 (unsigned_long Val,ZeroBehavior ZB)

{
  int iVar1;
  ZeroBehavior ZB_local;
  unsigned_long Val_local;
  
  if ((ZB == ZB_Undefined) || (Val != 0)) {
    iVar1 = 0;
    for (; (Val & 1) == 0; Val = Val >> 1 | 0x8000000000000000) {
      iVar1 = iVar1 + 1;
    }
    Val_local = (unsigned_long)iVar1;
  }
  else {
    Val_local = 0x40;
  }
  return Val_local;
}

Assistant:

static std::size_t count(T Val, ZeroBehavior ZB) {
    if (ZB != ZB_Undefined && Val == 0)
      return 64;

#if __has_builtin(__builtin_ctzll) || LLVM_GNUC_PREREQ(4, 0, 0)
    return __builtin_ctzll(Val);
#elif defined(_MSC_VER)
    unsigned long Index;
    _BitScanForward64(&Index, Val);
    return Index;
#endif
  }